

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketServerTestCase.cpp
# Opt level: O1

void __thiscall
SuiteSocketServerTests::TestsocketServerFixtureaccept::RunImpl(TestsocketServerFixtureaccept *this)

{
  socketServerFixtureacceptHelper fixtureHelper;
  socketServerFixtureacceptHelper local_1c0 [6];
  
  local_1c0[0].m_details = &(this->super_Test).m_details;
  local_1c0[0].super_socketServerFixture.bufLen = 0;
  local_1c0[0].super_socketServerFixture.connect = 0;
  local_1c0[0].super_socketServerFixture.write = 0;
  local_1c0[0].super_socketServerFixture.data = 0;
  local_1c0[0].super_socketServerFixture.disconnect = 0;
  local_1c0[0].super_socketServerFixture.connectSocket = 0;
  local_1c0[0].super_socketServerFixture.writeSocket = 0;
  local_1c0[0].super_socketServerFixture.dataSocket = 0;
  local_1c0[0].super_socketServerFixture.disconnectSocket = 0;
  local_1c0[0].super_socketServerFixture.super_Strategy._vptr_Strategy =
       (_func_int **)&PTR__Strategy_0032e928;
  UnitTest::ExecuteTest<SuiteSocketServerTests::socketServerFixtureacceptHelper>
            (local_1c0,local_1c0[0].m_details);
  return;
}

Assistant:

TEST_FIXTURE(socketServerFixture, accept)
{
  SocketServer object( 0 );
  socket_handle serverS1 = object.add( TestSettings::port, true, true );
  socket_handle clientS1 = createSocket( TestSettings::port, "127.0.0.1" );
  CHECK( clientS1 > 0 );
  process_sleep(0.1);
  socket_handle s1 = object.accept( serverS1 );
  CHECK( s1 >= 0 );
  object.block( *this );
  CHECK( object.numConnections() == 1 );

  socket_handle clientS2 = createSocket( TestSettings::port, "127.0.0.1" );
  CHECK( clientS2 > 0 );
  process_sleep(0.1);
  socket_handle s2 = object.accept( serverS1 );
  CHECK( s2 >= 0 );
  object.block( *this );
  CHECK( object.numConnections() == 2 );

  socket_handle clientS3 = createSocket( TestSettings::port, "127.0.0.1" );
  CHECK( clientS3 > 0 );
  process_sleep(0.1);
  socket_handle s3 = object.accept( serverS1 );
  CHECK( s3 >= 0 );
  object.block( *this );
  CHECK( object.numConnections() == 3 );

  SocketMonitor& monitor = object.getMonitor();
  CHECK( !monitor.drop( -1 ) );
  CHECK( object.numConnections() == 3 );
  CHECK( monitor.drop( s1 ) );
  CHECK( object.numConnections() == 2 );
  CHECK( monitor.drop( s2 ) );
  CHECK( object.numConnections() == 1 );
  CHECK( monitor.drop( s3 ) );
  CHECK( object.numConnections() == 0 );

  destroySocket( clientS1 );
  destroySocket( clientS2 );
  destroySocket( clientS3 );
}